

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.h
# Opt level: O2

void __thiscall
ThreadContext::QueueFreeOldEntryPointInfoIfInScript
          (ThreadContext *this,FunctionEntryPointInfo *oldEntryPointInfo)

{
  bool bVar1;
  RecyclableData *pRVar2;
  
  if ((this->callRootLevel != 0) &&
     ((oldEntryPointInfo->nextEntryPoint).ptr == (FunctionEntryPointInfo *)0x0)) {
    bVar1 = Js::EntryPointInfo::IsCleanedUp(&oldEntryPointInfo->super_EntryPointInfo);
    if (!bVar1) {
      pRVar2 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                         (&this->recyclableData);
      Memory::WriteBarrierPtr<Js::FunctionEntryPointInfo>::operator=
                (&oldEntryPointInfo->nextEntryPoint,&pRVar2->oldEntryPointInfo);
      pRVar2 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                         (&this->recyclableData);
      Memory::WriteBarrierPtr<Js::FunctionEntryPointInfo>::WriteBarrierSet
                (&pRVar2->oldEntryPointInfo,oldEntryPointInfo);
      return;
    }
  }
  return;
}

Assistant:

void QueueFreeOldEntryPointInfoIfInScript(Js::FunctionEntryPointInfo* oldEntryPointInfo)
    {
        if (this->IsInScript())
        {
            // Add it to the list only if it's not already in it
            if (oldEntryPointInfo->nextEntryPoint == nullptr && !oldEntryPointInfo->IsCleanedUp())
            {
                oldEntryPointInfo->nextEntryPoint = recyclableData->oldEntryPointInfo;
                recyclableData->oldEntryPointInfo = oldEntryPointInfo;
            }
        }
    }